

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1adff5::SpecialSubstitution::printLeft(SpecialSubstitution *this,OutputStream *S)

{
  char *pcVar1;
  size_t sVar2;
  undefined8 uVar3;
  long lVar4;
  
  switch(*(undefined4 *)&(this->super_Node).field_0xc) {
  case 0:
    lVar4 = 0xe;
    OutputStream::grow(S,0xe);
    pcVar1 = S->Buffer;
    sVar2 = S->CurrentPosition;
    builtin_strncpy(pcVar1 + sVar2 + 6,"llocator",8);
    uVar3 = 0x6c6c613a3a647473;
    goto LAB_0015936c;
  case 1:
    lVar4 = 0x11;
    OutputStream::grow(S,0x11);
    builtin_strncpy(S->Buffer + S->CurrentPosition,"std::basic_string",0x11);
    break;
  case 2:
    lVar4 = 0xb;
    OutputStream::grow(S,0xb);
    builtin_strncpy(S->Buffer + S->CurrentPosition,"std::string",0xb);
    break;
  case 3:
    OutputStream::grow(S,0xc);
    pcVar1 = S->Buffer;
    sVar2 = S->CurrentPosition;
    uVar3 = 0x7473693a3a647473;
    goto LAB_001592f7;
  case 4:
    OutputStream::grow(S,0xc);
    pcVar1 = S->Buffer;
    sVar2 = S->CurrentPosition;
    uVar3 = 0x74736f3a3a647473;
LAB_001592f7:
    lVar4 = 0xc;
    *(undefined8 *)(pcVar1 + sVar2) = uVar3;
    pcVar1 = pcVar1 + sVar2 + 8;
    pcVar1[0] = 'r';
    pcVar1[1] = 'e';
    pcVar1[2] = 'a';
    pcVar1[3] = 'm';
    break;
  case 5:
    lVar4 = 0xd;
    OutputStream::grow(S,0xd);
    pcVar1 = S->Buffer;
    sVar2 = S->CurrentPosition;
    builtin_strncpy(pcVar1 + sVar2 + 5,"iostream",8);
    uVar3 = 0x736f693a3a647473;
LAB_0015936c:
    *(undefined8 *)(pcVar1 + sVar2) = uVar3;
    break;
  default:
    goto switchD_0015922e_default;
  }
  S->CurrentPosition = S->CurrentPosition + lVar4;
switchD_0015922e_default:
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    switch (SSK) {
    case SpecialSubKind::allocator:
      S += "std::allocator";
      break;
    case SpecialSubKind::basic_string:
      S += "std::basic_string";
      break;
    case SpecialSubKind::string:
      S += "std::string";
      break;
    case SpecialSubKind::istream:
      S += "std::istream";
      break;
    case SpecialSubKind::ostream:
      S += "std::ostream";
      break;
    case SpecialSubKind::iostream:
      S += "std::iostream";
      break;
    }
  }